

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_c0cfb6::HBDTemporalFilterTest::SetUp(HBDTemporalFilterTest *this)

{
  _func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_mv_ptr_int_ptr_int_int_int_uchar_ptr_uint_ptr_unsigned_short_ptr
  *p_Var1;
  internal iVar2;
  undefined8 *puVar3;
  ParamType *pPVar4;
  uint16_t *puVar5;
  SEARCH_METHODS *pSVar6;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  pPVar4 = testing::
           WithParamInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
           ::GetParam();
  p_Var1 = (pPVar4->
           super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
           ).
           super__Head_base<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_false>
           ._M_head_impl.tst_func;
  (this->params_).ref_func =
       (pPVar4->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
       ).
       super__Head_base<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_false>
       ._M_head_impl.ref_func;
  (this->params_).tst_func = p_Var1;
  (this->params_).bit_depth =
       (pPVar4->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
       ).
       super__Head_base<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_false>
       ._M_head_impl.bit_depth;
  pPVar4 = testing::
           WithParamInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
           ::GetParam();
  this->tf_wgt_calc_lvl_ =
       (pPVar4->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
       ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  (this->rnd_).random_.state_ = 0xbaba;
  puVar5 = (uint16_t *)aom_memalign(0x10,0x1800);
  this->src1_ = puVar5;
  puVar5 = (uint16_t *)aom_memalign(0x10,0x1800);
  this->src2_ = puVar5;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            (local_30,"src1_","nullptr",&this->src1_,&local_40._M_head_impl);
  iVar2 = local_30[0];
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = (SEARCH_METHODS *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/temporal_filter_test.cc"
               ,0x1c2,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  puVar3 = local_28;
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(puVar3);
  }
  if (iVar2 != (internal)0x0) {
    local_40._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              (local_30,"src2_","nullptr",&this->src2_,&local_40._M_head_impl);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28 == (undefined8 *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = (SEARCH_METHODS *)*local_28;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/temporal_filter_test.cc"
                 ,0x1c3,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_40._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_40._M_head_impl + 8))();
      }
    }
    if (local_28 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_28 != local_28 + 2) {
        operator_delete((undefined8 *)*local_28);
      }
      operator_delete(local_28);
    }
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = GET_PARAM(0);
    tf_wgt_calc_lvl_ = GET_PARAM(1);
    rnd_.Reset(ACMRandom::DeterministicSeed());
    src1_ = reinterpret_cast<uint16_t *>(
        aom_memalign(16, sizeof(uint16_t) * MAX_MB_PLANE * BH * BW));
    src2_ = reinterpret_cast<uint16_t *>(
        aom_memalign(16, sizeof(uint16_t) * MAX_MB_PLANE * BH * BW));

    ASSERT_NE(src1_, nullptr);
    ASSERT_NE(src2_, nullptr);
  }